

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameconfigfile.cpp
# Opt level: O2

void __thiscall FGameConfigFile::DoGameSetup(FGameConfigFile *this,char *gamename)

{
  char *__s1;
  char *pcVar1;
  bool bVar2;
  int iVar3;
  size_t __n;
  char *name;
  FGameConfigFile *this_00;
  char *value;
  char *key;
  
  pcVar1 = this->section;
  iVar3 = mysnprintf(pcVar1,0x40,"%s.",gamename);
  __n = 0x3f - (long)iVar3;
  this->sublen = __n;
  this->subsection = this->section + iVar3;
  this->section[0x3f] = '\0';
  strncpy(this->section + iVar3,"UnknownConsoleVariables",__n);
  bVar2 = FConfigFile::SetSection(&this->super_FConfigFile,pcVar1,false);
  if (bVar2) {
    ReadCVars(this,0);
  }
  strncpy(this->subsection,"ConsoleVariables",this->sublen);
  this_00 = this;
  bVar2 = FConfigFile::SetSection(&this->super_FConfigFile,pcVar1,false);
  if (bVar2) {
    this_00 = this;
    ReadCVars(this,0);
  }
  if ((gameinfo.gametype & GAME_Raven) != GAME_Any) {
    SetRavenDefaults(this_00,gameinfo.gametype == GAME_Hexen);
  }
  strncpy(this->subsection,"LocalServerInfo",this->sublen);
  bVar2 = FConfigFile::SetSection(&this->super_FConfigFile,pcVar1,false);
  if (bVar2) {
    ReadCVars(this,0);
  }
  strncpy(this->subsection,"Player",this->sublen);
  bVar2 = FConfigFile::SetSection(&this->super_FConfigFile,pcVar1,false);
  if (bVar2) {
    ReadCVars(this,0);
  }
  strncpy(this->subsection,"ConsoleAliases",this->sublen);
  bVar2 = FConfigFile::SetSection(&this->super_FConfigFile,pcVar1,false);
  if (bVar2) {
    pcVar1 = (char *)0x0;
    while (name = pcVar1, bVar2 = FConfigFile::NextInSection(&this->super_FConfigFile,&key,&value),
          __s1 = key, bVar2) {
      iVar3 = strcasecmp(key,"Name");
      pcVar1 = value;
      if ((iVar3 != 0) &&
         (iVar3 = strcasecmp(__s1,"Command"), pcVar1 = name, iVar3 == 0 && name != (char *)0x0)) {
        C_SetAlias(name,value);
        pcVar1 = (char *)0x0;
      }
    }
  }
  (this->super_FConfigFile).OkayToWrite = true;
  return;
}

Assistant:

void FGameConfigFile::DoGameSetup (const char *gamename)
{
	const char *key;
	const char *value;

	sublen = countof(section) - 1 - mysnprintf (section, countof(section), "%s.", gamename);
	subsection = section + countof(section) - sublen - 1;
	section[countof(section) - 1] = '\0';
	
	strncpy (subsection, "UnknownConsoleVariables", sublen);
	if (SetSection (section))
	{
		ReadCVars (0);
	}

	strncpy (subsection, "ConsoleVariables", sublen);
	if (SetSection (section))
	{
		ReadCVars (0);
	}

	if (gameinfo.gametype & GAME_Raven)
	{
		SetRavenDefaults (gameinfo.gametype == GAME_Hexen);
	}

	// The NetServerInfo section will be read and override anything loaded
	// here when it's determined that a netgame is being played.
	strncpy (subsection, "LocalServerInfo", sublen);
	if (SetSection (section))
	{
		ReadCVars (0);
	}

	strncpy (subsection, "Player", sublen);
	if (SetSection (section))
	{
		ReadCVars (0);
	}

	strncpy (subsection, "ConsoleAliases", sublen);
	if (SetSection (section))
	{
		const char *name = NULL;
		while (NextInSection (key, value))
		{
			if (stricmp (key, "Name") == 0)
			{
				name = value;
			}
			else if (stricmp (key, "Command") == 0 && name != NULL)
			{
				C_SetAlias (name, value);
				name = NULL;
			}
		}
	}
	OkayToWrite = true;
}